

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

InterfaceSchema __thiscall capnp::Schema::asInterface(Schema *this)

{
  bool bVar1;
  Reader local_90;
  ArrayPtr<const_char> local_60;
  Fault local_50;
  Fault f;
  Schema *this_local;
  
  getProto((Reader *)&f,this);
  bVar1 = capnp::schema::Node::Reader::isInterface((Reader *)&f);
  if (bVar1) {
    InterfaceSchema::InterfaceSchema((InterfaceSchema *)&this_local,(Schema)this->raw);
  }
  else {
    getProto(&local_90,this);
    local_60 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_90);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51],capnp::Text::Reader>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x11d,FAILED,"getProto().isInterface()",
               "\"Tried to use non-interface schema as an interface.\", getProto().getDisplayName()"
               ,(char (*) [51])"Tried to use non-interface schema as an interface.",
               (Reader *)&local_60);
    InterfaceSchema::InterfaceSchema((InterfaceSchema *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_50);
  }
  return (InterfaceSchema)(Schema)this_local;
}

Assistant:

InterfaceSchema Schema::asInterface() const {
  KJ_REQUIRE(getProto().isInterface(), "Tried to use non-interface schema as an interface.",
             getProto().getDisplayName()) {
    return InterfaceSchema();
  }
  return InterfaceSchema(*this);
}